

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_cleanEmptyComponentEncapsulation_Test::~Model_cleanEmptyComponentEncapsulation_Test
          (Model_cleanEmptyComponentEncapsulation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, cleanEmptyComponentEncapsulation)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "  <component name=\"c2\"/>\n"
        "  <component/>\n"
        "  <component name=\"c4\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref>\n"
        "      <component_ref component=\"c2\"/>\n"
        "      <component_ref>\n"
        "        <component_ref component=\"c4\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    auto model = libcellml::Model::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create("c2");
    auto c3 = libcellml::Component::create();
    auto c4 = libcellml::Component::create("c4");
    auto c5 = libcellml::Component::create();
    auto c6 = libcellml::Component::create();

    model->addComponent(c1);
    c1->addComponent(c2);
    c1->addComponent(c3);
    c3->addComponent(c4);
    c3->addComponent(c5);
    c5->addComponent(c6);

    // Call the Model::clean() function to remove empty components.
    model->clean();
    auto p = libcellml::Printer::create();
    EXPECT_EQ(e, p->printModel(model));
}